

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# md.c
# Opt level: O3

int mbedtls_md_hmac(mbedtls_md_info_t *md_info,uchar *key,size_t keylen,uchar *input,size_t ilen,
                   uchar *output)

{
  void *pvVar1;
  int iVar2;
  mbedtls_md_context_t local_48;
  
  if (md_info == (mbedtls_md_info_t *)0x0) {
    iVar2 = -0x5100;
  }
  else {
    pvVar1 = (*md_info->ctx_alloc_func)();
    iVar2 = -0x5180;
    if (pvVar1 != (void *)0x0) {
      local_48.md_ctx = pvVar1;
      local_48.hmac_ctx = calloc(2,(long)md_info->block_size);
      if (local_48.hmac_ctx == (void *)0x0) {
        (*md_info->ctx_free_func)(pvVar1);
      }
      else {
        local_48.md_info = md_info;
        mbedtls_md_hmac_starts(&local_48,key,keylen);
        (*md_info->update_func)(pvVar1,input,ilen);
        mbedtls_md_hmac_finish(&local_48,output);
        mbedtls_md_free(&local_48);
        iVar2 = 0;
      }
    }
  }
  return iVar2;
}

Assistant:

int mbedtls_md_hmac( const mbedtls_md_info_t *md_info, const unsigned char *key, size_t keylen,
                const unsigned char *input, size_t ilen,
                unsigned char *output )
{
    mbedtls_md_context_t ctx;
    int ret;

    if( md_info == NULL )
        return( MBEDTLS_ERR_MD_BAD_INPUT_DATA );

    mbedtls_md_init( &ctx );

    if( ( ret = mbedtls_md_setup( &ctx, md_info, 1 ) ) != 0 )
        return( ret );

    mbedtls_md_hmac_starts( &ctx, key, keylen );
    mbedtls_md_hmac_update( &ctx, input, ilen );
    mbedtls_md_hmac_finish( &ctx, output );

    mbedtls_md_free( &ctx );

    return( 0 );
}